

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::collapseAccessChain(Builder *this)

{
  Id IVar1;
  StorageClass storageClass_00;
  size_type sVar2;
  StorageClass storageClass;
  Builder *this_local;
  
  if (((this->accessChain).isRValue & 1U) == 0) {
    if ((this->accessChain).instr == 0) {
      remapDynamicSwizzle(this);
      if ((this->accessChain).component != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&(this->accessChain).indexChain,&(this->accessChain).component);
        (this->accessChain).component = 0;
      }
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&(this->accessChain).indexChain);
      if (sVar2 == 0) {
        this_local._4_4_ = (this->accessChain).base;
      }
      else {
        IVar1 = getTypeId(this,(this->accessChain).base);
        storageClass_00 = Module::getStorageClass(&this->module,IVar1);
        IVar1 = createAccessChain(this,storageClass_00,(this->accessChain).base,
                                  &(this->accessChain).indexChain);
        (this->accessChain).instr = IVar1;
        this_local._4_4_ = (this->accessChain).instr;
      }
    }
    else {
      this_local._4_4_ = (this->accessChain).instr;
    }
    return this_local._4_4_;
  }
  __assert_fail("accessChain.isRValue == false",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x1093,"Id spv::Builder::collapseAccessChain()");
}

Assistant:

Id Builder::collapseAccessChain()
{
    assert(accessChain.isRValue == false);

    // did we already emit an access chain for this?
    if (accessChain.instr != NoResult)
        return accessChain.instr;

    // If we have a dynamic component, we can still transfer
    // that into a final operand to the access chain.  We need to remap the
    // dynamic component through the swizzle to get a new dynamic component to
    // update.
    //
    // This was not done in transferAccessChainSwizzle() because it might
    // generate code.
    remapDynamicSwizzle();
    if (accessChain.component != NoResult) {
        // transfer the dynamic component to the access chain
        accessChain.indexChain.push_back(accessChain.component);
        accessChain.component = NoResult;
    }

    // note that non-trivial swizzling is left pending

    // do we have an access chain?
    if (accessChain.indexChain.size() == 0)
        return accessChain.base;

    // emit the access chain
    StorageClass storageClass = (StorageClass)module.getStorageClass(getTypeId(accessChain.base));
    accessChain.instr = createAccessChain(storageClass, accessChain.base, accessChain.indexChain);

    return accessChain.instr;
}